

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall psy::C::Scope::Scope(Scope *this,ScopeKind scopeK)

{
  this->_vptr_Scope = (_func_int **)&PTR__Scope_0053a108;
  this->scopeK_ = scopeK;
  this->outerScope_ = (Scope *)0x0;
  (this->decls_)._M_h._M_buckets = &(this->decls_)._M_h._M_single_bucket;
  (this->decls_)._M_h._M_bucket_count = 1;
  (this->decls_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decls_)._M_h._M_element_count = 0;
  (this->decls_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decls_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decls_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Scope::Scope(ScopeKind scopeK)
    : scopeK_(scopeK)
    , outerScope_(nullptr)
{}